

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O3

ssize_t __thiscall remote::Handle::WriteMemory(Handle *this,void *address,void *buffer,size_t size)

{
  ssize_t sVar1;
  iovec remote [1];
  iovec local [1];
  void *local_28;
  size_t local_20;
  void *local_18;
  size_t local_10;
  
  local_28 = address;
  local_20 = size;
  local_18 = buffer;
  local_10 = size;
  sVar1 = process_vm_writev(this->pid,&local_18,1,&local_28,1,0);
  return sVar1;
}

Assistant:

ssize_t Handle::WriteMemory(void* address, void* buffer, size_t size) {
    struct iovec local[1];
    struct iovec remote[1];

    local[0].iov_base = buffer;
    local[0].iov_len = size;
    remote[0].iov_base = address;
    remote[0].iov_len = size;

    return process_vm_writev(pid, local, 1, remote, 1, 0);
}